

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

void Dau_DecFindSetsTest(void)

{
  word t;
  
  t = 0x30f00d0d3fff;
  Dau_DecTrySets(&t,6,1);
  return;
}

Assistant:

void Dau_DecFindSetsTest()
{
    int nVars = 6;
//    word a0 = (~s_Truths6[1] & s_Truths6[2]) | (s_Truths6[1] & s_Truths6[3]);
//    word a1 = (~s_Truths6[1] & s_Truths6[4]) | (s_Truths6[1] & s_Truths6[5]);
//    word t  = (~s_Truths6[0] & a0)           | (s_Truths6[0] & a1); 
//    word t = ABC_CONST(0x7EFFFFFFFFFFFF7E); // and(gam1,gam2)
//    word t = ABC_CONST(0xB0F0BBFFB0F0BAFE); // some funct
//    word t = ABC_CONST(0x00000000901FFFFF); // some funct
    word t = ABC_CONST(0x000030F00D0D3FFF); // some funct
//    word t = ABC_CONST(0x00000000690006FF); // some funct
//    word t = ABC_CONST(0x7000F80007FF0FFF); // some funct
//    word t = ABC_CONST(0x4133CB334133CB33); // some funct 5 var
//    word t = ABC_CONST(0x2B0228022B022802); // 5-var non-dec0x0F7700000F770000
//    word t = ABC_CONST(0x0F7700000F770000); // (!<(ab)cd>e)
//    word t = ABC_CONST(0x7F00000000000000); // (!(abc)def)
    Dau_DecTrySets( &t, nVars, 1 );
}